

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int resolveExprStep(Walker *pWalker,Expr *pExpr)

{
  byte *pbVar1;
  RenameToken **ppRVar2;
  byte bVar3;
  ushort uVar4;
  NameContext *pNVar5;
  Parse *pParse;
  ExprList *pEVar6;
  sqlite3 *db;
  _func_void_sqlite3_context_ptr *p_Var7;
  SrcList *pSVar8;
  IdList *pIVar9;
  Schema *pSVar10;
  u8 uVar11;
  ynVar yVar12;
  int iVar13;
  size_t sVar14;
  FuncDef *pFunc;
  Expr *pEVar15;
  NameContext *pNVar16;
  Column *pCVar17;
  RenameToken *pRVar18;
  Window *pWVar19;
  ushort uVar20;
  ulong uVar21;
  Expr *pEVar22;
  SrcList_item *pSVar23;
  char *pcVar24;
  Select *pSVar25;
  int iVar26;
  char *pcVar27;
  RenameToken *pRVar28;
  char *pcVar29;
  Window *pWVar30;
  Schema **ppSVar31;
  long lVar32;
  Table *pTVar33;
  uint uVar34;
  char **ppcVar35;
  int iVar36;
  Table **ppTVar37;
  long lVar38;
  int iVar39;
  uint uVar40;
  uint uVar41;
  ExprList_item *pEVar42;
  char *zCol;
  char *pcVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  Walker w;
  u8 local_115;
  int local_114;
  int local_d4;
  SrcList_item *local_c8;
  Schema *local_b8;
  int *local_b0;
  int local_a4;
  sqlite3 *local_a0;
  SrcList *local_70;
  undefined8 local_68;
  Walker local_60;
  
  pNVar5 = (pWalker->u).pNC;
  pParse = pNVar5->pParse;
  bVar3 = pExpr->op;
  if (0x82 < bVar3) {
    if (bVar3 < 0x94) {
      if (bVar3 != 0x83) {
        if (bVar3 != 0x86) goto switchD_00199d68_caseD_2e;
        pEVar22 = pExpr->pLeft;
        if ((pNVar5->ncFlags & 0x20) != 0) {
          sqlite3ErrorMsg(pParse,"%s prohibited in %s","the \".\" operator","index expressions");
        }
        pEVar15 = pExpr->pRight;
        if (pEVar15->op == ';') {
          pcVar27 = (char *)0x0;
        }
        else {
          pcVar27 = (pEVar22->u).zToken;
          pEVar22 = pEVar15->pLeft;
          pEVar15 = pEVar15->pRight;
        }
        pcVar29 = (pEVar22->u).zToken;
        zCol = (pEVar15->u).zToken;
        if ((1 < pParse->eParseMode) &&
           (pRVar18 = pParse->pRename, pRVar28 = pRVar18, pRVar18 != (RenameToken *)0x0)) {
          do {
            if ((Expr *)pRVar28->p == pEVar15) {
              pRVar28->p = pExpr;
              pRVar18 = pParse->pRename;
              break;
            }
            ppRVar2 = &pRVar28->pNext;
            pRVar28 = *ppRVar2;
          } while (*ppRVar2 != (RenameToken *)0x0);
          if (pRVar18 != (RenameToken *)0x0) {
            do {
              if ((Expr *)pRVar18->p == pEVar22) {
                pRVar18->p = &pExpr->y;
                break;
              }
              pRVar18 = pRVar18->pNext;
            } while (pRVar18 != (RenameToken *)0x0);
          }
        }
        local_a0 = pParse->db;
        pExpr->iTable = -1;
        if ((pcVar27 != (char *)0x0) && ((pNVar5->ncFlags & 6) == 0)) {
          if (0 < (long)local_a0->nDb) {
            local_b8 = (Schema *)0x0;
            lVar32 = 0;
LAB_0019ac16:
            lVar38 = 0;
            do {
              bVar3 = local_a0->aDb[lVar32].zDbSName[lVar38];
              if (bVar3 == pcVar27[lVar38]) {
                if ((ulong)bVar3 == 0) {
                  local_b8 = local_a0->aDb[lVar32].pSchema;
                  goto LAB_0019a391;
                }
              }
              else if (""[bVar3] != ""[(byte)pcVar27[lVar38]]) goto LAB_0019ac49;
              lVar38 = lVar38 + 1;
            } while( true );
          }
          local_b8 = (Schema *)0x0;
          goto LAB_0019a391;
        }
        goto LAB_0019a38c;
      }
      goto switchD_00199d68_caseD_31;
    }
    if (bVar3 == 0x94) {
      uVar34 = pNVar5->ncFlags;
      if ((uVar34 & 0x26) != 0) {
        pcVar27 = "CHECK constraints";
        if ((uVar34 & 4) == 0) {
          pcVar27 = "partial index WHERE clauses";
        }
        pcVar29 = "index expressions";
        if ((uVar34 & 0x20) == 0) {
          pcVar29 = pcVar27;
        }
        sqlite3ErrorMsg(pParse,"%s prohibited in %s","parameters",pcVar29);
      }
      goto switchD_00199d68_caseD_2e;
    }
    if (bVar3 == 0xa0) goto switchD_00199d68_caseD_2d;
    if (bVar3 != 0xa1) goto switchD_00199d68_caseD_2e;
    pEVar6 = (pExpr->x).pList;
    uVar21 = 0;
    iVar13 = 0;
    if (pEVar6 != (ExprList *)0x0) {
      iVar13 = pEVar6->nExpr;
    }
    db = pParse->db;
    uVar11 = db->enc;
    uVar34 = pNVar5->ncFlags;
    pcVar27 = (pExpr->u).zToken;
    if (pcVar27 != (char *)0x0) {
      sVar14 = strlen(pcVar27);
      uVar21 = (ulong)((uint)sVar14 & 0x3fffffff);
    }
    pFunc = sqlite3FindFunction(db,pcVar27,iVar13,uVar11,'\0');
    if (pFunc == (FuncDef *)0x0) {
      bVar44 = false;
      pFunc = sqlite3FindFunction(pParse->db,pcVar27,-2,uVar11,'\0');
      bVar45 = pFunc == (FuncDef *)0x0;
      bVar47 = !bVar45;
      if (1 < pParse->eParseMode) goto LAB_0019aee2;
LAB_0019a2e3:
      if (((pFunc != (FuncDef *)0x0) && (pFunc->xValue == (_func_void_sqlite3_context_ptr *)0x0)) &&
         ((pExpr->flags & 0x1000000) != 0)) {
        pcVar29 = "%.*s() may not be used as a window function";
        goto LAB_0019ada3;
      }
      if (bVar44) {
        if ((pNVar5->ncFlags & 1U) != 0) {
          if ((pFunc->funcFlags >> 0x10 & 1) == 0) {
            bVar46 = (pExpr->y).pTab != (Table *)0x0;
          }
          else {
            bVar46 = true;
            if ((pExpr->y).pTab == (Table *)0x0) goto LAB_0019ad3f;
          }
          if (!bVar46 || ((uint)pNVar5->ncFlags >> 0xe & 1) != 0) goto LAB_0019ad6a;
        }
LAB_0019ad3f:
        if ((pFunc->funcFlags >> 0x10 & 1) == 0) {
          pcVar29 = "window";
          if ((pExpr->y).pTab == (Table *)0x0) {
            pcVar29 = "aggregate";
          }
        }
        else {
          pcVar29 = "window";
        }
        sqlite3ErrorMsg(pParse,"misuse of %s function %.*s()",pcVar29,uVar21,pcVar27);
        pNVar5->nErr = pNVar5->nErr + 1;
        goto LAB_0019aee2;
      }
LAB_0019ad6a:
      if (bVar47) {
        if (!bVar45) {
          pcVar29 = "wrong number of arguments to function %.*s()";
LAB_0019ada3:
          sqlite3ErrorMsg(pParse,pcVar29,uVar21,pcVar27);
          pNVar5->nErr = pNVar5->nErr + 1;
        }
      }
      else {
        bVar47 = (pParse->db->init).busy != '\0';
        pcVar29 = "no such function: %.*s";
        if (bVar47) {
          pcVar29 = "wrong number of arguments to function %.*s()";
        }
        if (!(bool)(bVar47 & bVar45)) goto LAB_0019ada3;
      }
      if (!bVar44) {
LAB_0019aee2:
        sqlite3WalkExprList(pWalker,pEVar6);
        return 1;
      }
      pNVar5->ncFlags = pNVar5->ncFlags & -(uint)((pExpr->y).pTab == (Table *)0x0) - 0x4001;
      sqlite3WalkExprList(pWalker,pEVar6);
    }
    else {
      p_Var7 = pFunc->xFinalize;
      bVar44 = p_Var7 != (_func_void_sqlite3_context_ptr *)0x0;
      if ((pFunc->funcFlags & 0x400) != 0) {
        pbVar1 = (byte *)((long)&pExpr->flags + 2);
        *pbVar1 = *pbVar1 | 4;
        if (iVar13 == 2) {
          iVar13 = exprProbability(*(Expr **)(pEVar6 + 1));
          pExpr->iTable = iVar13;
          if (iVar13 < 0) {
            sqlite3ErrorMsg(pParse,
                            "second argument to likelihood() must be a constant between 0.0 and 1.0"
                           );
            pNVar5->nErr = pNVar5->nErr + 1;
          }
        }
        else {
          iVar13 = 0x7800000;
          if (*pFunc->zName == 'u') {
            iVar13 = 0x800000;
          }
          pExpr->iTable = iVar13;
        }
      }
      iVar13 = sqlite3AuthCheck(pParse,0x1f,(char *)0x0,pFunc->zName,(char *)0x0);
      if (iVar13 != 0) {
        if (iVar13 == 1) {
          sqlite3ErrorMsg(pParse,"not authorized to use function: %s",pFunc->zName);
          pNVar5->nErr = pNVar5->nErr + 1;
        }
        pExpr->op = 'r';
        return 1;
      }
      uVar40 = pFunc->funcFlags;
      if ((uVar40 & 0x2800) != 0) {
        pbVar1 = (byte *)((long)&pExpr->flags + 2);
        *pbVar1 = *pbVar1 | 8;
      }
      if ((uVar40 >> 0xb & 1) == 0) {
        notValid(pParse,(NameContext *)(ulong)(uint)pNVar5->ncFlags,"non-deterministic functions",
                 0x22);
        uVar40 = pFunc->funcFlags;
      }
      bVar45 = true;
      bVar47 = true;
      if (((uVar40 >> 0x12 & 1) != 0) &&
         (bVar46 = pParse->nested != '\0', bVar47 = sqlite3Config.bInternalFunctions != 0 || bVar46,
         sqlite3Config.bInternalFunctions == 0 && !bVar46)) {
        pFunc = (FuncDef *)0x0;
      }
      if (pParse->eParseMode < 2) goto LAB_0019a2e3;
      sqlite3WalkExprList(pWalker,pEVar6);
      if (p_Var7 == (_func_void_sqlite3_context_ptr *)0x0) {
        return 1;
      }
    }
    pWVar30 = (pExpr->y).pWin;
    if (pWVar30 == (Window *)0x0) {
      pExpr->op = 0xa3;
      pExpr->op2 = '\0';
      pNVar16 = pNVar5;
      do {
        local_70 = pNVar16->pSrcList;
        local_60.xExprCallback = exprSrcCount;
        local_60.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
        local_68 = 0;
        local_60.u.pNC = (NameContext *)&local_70;
        sqlite3WalkExprList(&local_60,(pExpr->x).pList);
        if ((0 < (int)local_68) || (local_68._4_4_ == 0)) {
          pNVar16->ncFlags = pFunc->funcFlags & 0x1000 | pNVar16->ncFlags | 0x10;
          break;
        }
        pExpr->op2 = pExpr->op2 + '\x01';
        pNVar16 = pNVar16->pNext;
      } while (pNVar16 != (NameContext *)0x0);
      goto LAB_0019af79;
    }
    pSVar25 = pNVar5->pWinSelect;
    if (pParse->eParseMode < 2) {
      sqlite3WindowUpdate(pParse,pSVar25->pWinDefn,pWVar30,pFunc);
      pWVar30 = (pExpr->y).pWin;
    }
    sqlite3WalkExprList(pWalker,pWVar30->pPartition);
    sqlite3WalkExprList(pWalker,((pExpr->y).pWin)->pOrderBy);
    pWVar30 = (pExpr->y).pWin;
    if (pWVar30->pFilter != (Expr *)0x0) {
      walkExpr(pWalker,pWVar30->pFilter);
      pWVar30 = (pExpr->y).pWin;
    }
    if (pSVar25->pWin == (Window *)0x0) {
      pWVar19 = (Window *)0x0;
LAB_0019af51:
      pWVar30->pNextWin = pWVar19;
      pSVar25->pWin = (Window *)pExpr->y;
    }
    else {
      iVar13 = sqlite3WindowCompare(pParse,pSVar25->pWin,pWVar30);
      if (iVar13 == 0) {
        pWVar19 = pSVar25->pWin;
        pWVar30 = (pExpr->y).pWin;
        goto LAB_0019af51;
      }
    }
    pbVar1 = (byte *)((long)&pNVar5->ncFlags + 1);
    *pbVar1 = *pbVar1 | 0x80;
LAB_0019af79:
    pNVar5->ncFlags = pNVar5->ncFlags | uVar34 & 0x4001;
    return 1;
  }
  switch(bVar3) {
  case 0x2d:
    goto switchD_00199d68_caseD_2d;
  case 0x2e:
  case 0x2f:
  case 0x32:
  case 0x33:
  case 0x3a:
    goto switchD_00199d68_caseD_2e;
  case 0x30:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    goto switchD_00199d68_caseD_30;
  case 0x31:
    goto switchD_00199d68_caseD_31;
  case 0x3b:
    zCol = (pExpr->u).zToken;
    local_a0 = pParse->db;
    pExpr->iTable = -1;
    pcVar29 = (char *)0x0;
LAB_0019a38c:
    local_b8 = (Schema *)0x0;
    pcVar27 = (char *)0x0;
LAB_0019a391:
    local_b0 = &pExpr->iTable;
    ppTVar37 = &pParse->pTriggerTab;
    local_c8 = (SrcList_item *)0x0;
    local_115 = 0xa2;
    local_d4 = -1;
    local_a4 = 0;
    iVar13 = 0;
    pNVar16 = pNVar5;
LAB_0019a3f5:
    pSVar8 = pNVar16->pSrcList;
    if (pSVar8 == (SrcList *)0x0) {
      local_114 = 0;
    }
    else {
      iVar36 = pSVar8->nSrc;
      if (0 < iVar36) {
        pSVar23 = pSVar8->a;
        iVar26 = 0;
        local_114 = 0;
LAB_0019a42e:
        pTVar33 = pSVar23->pTab;
        pSVar25 = pSVar23->pSelect;
        if ((pSVar25 == (Select *)0x0) || ((pSVar25->selFlags & 0x800) == 0)) {
LAB_0019a44b:
          if ((pcVar27 != (char *)0x0) && (pTVar33->pSchema != local_b8)) goto LAB_0019a70b;
          if (pcVar29 != (char *)0x0) {
            pcVar43 = pSVar23->zAlias;
            pcVar24 = pcVar43;
            if (pcVar43 == (char *)0x0) {
              pcVar24 = pTVar33->zName;
            }
            lVar32 = 0;
            do {
              bVar3 = pcVar24[lVar32];
              if (bVar3 == pcVar29[lVar32]) {
                if ((ulong)bVar3 == 0) goto LAB_0019a54d;
              }
              else if (""[bVar3] != ""[(byte)pcVar29[lVar32]]) goto LAB_0019a70b;
              lVar32 = lVar32 + 1;
            } while( true );
          }
          goto LAB_0019a5c4;
        }
        lVar32 = (long)pSVar25->pEList->nExpr;
        bVar47 = false;
        if (lVar32 < 1) {
          bVar47 = false;
        }
        else {
          ppcVar35 = &pSVar25->pEList->a[0].zSpan;
          lVar38 = 0;
          do {
            iVar39 = sqlite3MatchSpanName(*ppcVar35,zCol,pcVar29,pcVar27);
            if (iVar39 != 0) {
              local_114 = local_114 + 1;
              pExpr->iColumn = (ynVar)lVar38;
              iVar13 = 2;
              bVar47 = true;
              local_c8 = pSVar23;
            }
            lVar38 = lVar38 + 1;
            ppcVar35 = ppcVar35 + 4;
          } while (lVar32 != lVar38);
        }
        if (pcVar29 != (char *)0x0 && !bVar47) goto LAB_0019a44b;
        goto LAB_0019a70b;
      }
      local_114 = 0;
LAB_0019a735:
      if (local_c8 == (SrcList_item *)0x0) {
        local_c8 = (SrcList_item *)0x0;
      }
      else {
        local_d4 = local_c8->iCursor;
        *local_b0 = local_d4;
        pTVar33 = local_c8->pTab;
        (pExpr->y).pTab = pTVar33;
        if (((local_c8->fg).jointype & 8) != 0) {
          pbVar1 = (byte *)((long)&pExpr->flags + 2);
          *pbVar1 = *pbVar1 | 0x10;
        }
        local_b8 = pTVar33->pSchema;
      }
    }
    if (iVar13 == 0 && (pcVar29 != (char *)0x0 && pcVar27 == (char *)0x0)) {
      pTVar33 = *ppTVar37;
      if (pTVar33 != (Table *)0x0) {
        if (pParse->eTriggerOp != 'y') {
          lVar32 = 0;
          do {
            bVar3 = "new"[lVar32];
            if (bVar3 == pcVar29[lVar32]) {
              if ((ulong)bVar3 == 0) goto LAB_0019a805;
            }
            else if (""[bVar3] != ""[(byte)pcVar29[lVar32]]) {
              if (pParse->eTriggerOp == 'x') goto LAB_0019a81b;
              break;
            }
            lVar32 = lVar32 + 1;
          } while( true );
        }
        lVar32 = 0;
        do {
          bVar3 = "wrong number of arguments to function fts5_fold"[lVar32 + 0x2c];
          if (bVar3 == pcVar29[lVar32]) {
            if ((ulong)bVar3 == 0) goto LAB_0019a801;
          }
          else if (""[bVar3] != ""[(byte)pcVar29[lVar32]]) break;
          lVar32 = lVar32 + 1;
        } while( true );
      }
LAB_0019a81b:
      pTVar33 = (Table *)0x0;
      goto LAB_0019a81d;
    }
    goto LAB_0019a989;
  default:
    if (bVar3 != 0x14) goto switchD_00199d68_caseD_2e;
    goto switchD_00199d68_caseD_31;
  }
LAB_0019ac49:
  lVar32 = lVar32 + 1;
  if (lVar32 == local_a0->nDb) goto LAB_0019a391;
  goto LAB_0019ac16;
LAB_0019a54d:
  if ((pcVar43 != (char *)0x0) && (1 < pParse->eParseMode)) {
    for (pRVar18 = pParse->pRename; pRVar18 != (RenameToken *)0x0; pRVar18 = pRVar18->pNext) {
      if ((anon_union_8_3_c79b3df9_for_y *)pRVar18->p == &pExpr->y) {
        pRVar18->p = (void *)0x0;
        break;
      }
    }
  }
LAB_0019a5c4:
  iVar39 = iVar13 + 1;
  if (iVar13 == 0) {
    local_c8 = pSVar23;
  }
  iVar13 = iVar39;
  if (0 < pTVar33->nCol) {
    pCVar17 = pTVar33->aCol;
    iVar39 = 0;
LAB_0019a5fe:
    lVar32 = 0;
    do {
      bVar3 = pCVar17->zName[lVar32];
      if (bVar3 == zCol[lVar32]) {
        if ((ulong)bVar3 == 0) goto LAB_0019a628;
      }
      else if (""[bVar3] != ""[(byte)zCol[lVar32]]) goto LAB_0019a698;
      lVar32 = lVar32 + 1;
    } while( true );
  }
LAB_0019a70b:
  iVar26 = iVar26 + 1;
  pSVar23 = pSVar23 + 1;
  if (iVar26 == iVar36) goto LAB_0019a735;
  goto LAB_0019a42e;
LAB_0019a628:
  if (local_114 == 1) {
    if (((pSVar23->fg).jointype & 4) != 0) {
LAB_0019a698:
      iVar39 = iVar39 + 1;
      pCVar17 = pCVar17 + 1;
      if (iVar39 == pTVar33->nCol) goto LAB_0019a70b;
      goto LAB_0019a5fe;
    }
    pIVar9 = pSVar23->pUsing;
    if ((pIVar9 != (IdList *)0x0) && (0 < (long)pIVar9->nId)) {
      lVar32 = 0;
LAB_0019a65b:
      lVar38 = 0;
      do {
        bVar3 = pIVar9->a[lVar32].zName[lVar38];
        if (bVar3 == zCol[lVar38]) {
          if ((ulong)bVar3 == 0) goto LAB_0019a698;
        }
        else if (""[bVar3] != ""[(byte)zCol[lVar38]]) goto LAB_0019a68e;
        lVar38 = lVar38 + 1;
      } while( true );
    }
  }
LAB_0019a6c9:
  local_114 = local_114 + 1;
  yVar12 = (ynVar)iVar39;
  if (iVar39 == pTVar33->iPKey) {
    yVar12 = -1;
  }
  pExpr->iColumn = yVar12;
  local_c8 = pSVar23;
  goto LAB_0019a70b;
LAB_0019a68e:
  lVar32 = lVar32 + 1;
  if (lVar32 == pIVar9->nId) goto LAB_0019a6c9;
  goto LAB_0019a65b;
LAB_0019a805:
  local_d4 = 1;
  goto LAB_0019a80a;
LAB_0019a801:
  local_d4 = 0;
LAB_0019a80a:
  *local_b0 = local_d4;
LAB_0019a81d:
  uVar34 = pNVar16->ncFlags;
  if (((uVar34 >> 9 & 1) != 0) && ((pNVar16->uNC).pUpsert != (Upsert *)0x0)) {
    lVar32 = 0;
    do {
      bVar3 = "excluded"[lVar32];
      if (bVar3 == pcVar29[lVar32]) {
        if ((ulong)bVar3 == 0) goto LAB_0019a861;
      }
      else if (""[bVar3] != ""[(byte)pcVar29[lVar32]]) break;
      lVar32 = lVar32 + 1;
    } while( true );
  }
LAB_0019a87c:
  if (pTVar33 == (Table *)0x0) {
    iVar13 = 0;
  }
  else {
    local_b8 = pTVar33->pSchema;
    uVar34 = (uint)pTVar33->nCol;
    if (0 < pTVar33->nCol) {
      pCVar17 = pTVar33->aCol;
      uVar40 = 0;
LAB_0019a899:
      lVar32 = 0;
      do {
        bVar3 = pCVar17->zName[lVar32];
        if (bVar3 == zCol[lVar32]) {
          if ((ulong)bVar3 == 0) {
            uVar41 = uVar40;
            if (uVar40 == (int)pTVar33->iPKey) {
              uVar41 = 0xffffffff;
            }
            goto LAB_0019a8f0;
          }
        }
        else if (""[bVar3] != ""[(byte)zCol[lVar32]]) goto LAB_0019a8c2;
        lVar32 = lVar32 + 1;
      } while( true );
    }
    uVar41 = 0;
LAB_0019a8f0:
    if ((int)uVar34 <= (int)uVar41) {
LAB_0019a8f5:
      iVar13 = sqlite3IsRowid(zCol);
      if (iVar13 != 0) {
        uVar41 = uVar41 | -(uint)((pTVar33->tabFlags & 0x40) == 0);
      }
    }
    iVar13 = 1;
    if ((int)uVar41 < (int)uVar34) {
      local_114 = local_114 + 1;
      if (local_d4 == 2) {
        if (pParse->eParseMode < 2) {
          local_d4 = uVar41 + ((pNVar16->uNC).pUpsert)->regData;
          pExpr->iTable = local_d4;
          pbVar1 = (byte *)((long)&pExpr->flags + 2);
          *pbVar1 = *pbVar1 | 0x40;
          local_115 = 0xa8;
        }
        else {
          pExpr->iColumn = (ynVar)uVar41;
          (pExpr->y).pTab = pTVar33;
          local_115 = 0xa2;
          local_d4 = 2;
        }
      }
      else {
        if ((int)uVar41 < 0) {
          pExpr->affinity = 'D';
        }
        else {
          uVar34 = 1 << ((byte)uVar41 & 0x1f);
          if (0x1f < uVar41) {
            uVar34 = 0xffffffff;
          }
          if (local_d4 == 0) {
            pParse->oldmask = pParse->oldmask | uVar34;
          }
          else {
            pParse->newmask = pParse->newmask | uVar34;
          }
        }
        (pExpr->y).pTab = pTVar33;
        pExpr->iColumn = (ynVar)uVar41;
        local_115 = 'M';
      }
    }
LAB_0019a989:
    uVar34 = pNVar16->ncFlags;
    if (((local_114 == 0) && (iVar13 == 1)) && (local_c8 != (SrcList_item *)0x0)) {
      local_114 = 0;
      iVar13 = 1;
      if ((uVar34 & 0x20) == 0) {
        iVar13 = sqlite3IsRowid(zCol);
        if ((iVar13 != 0) && ((local_c8->pTab->tabFlags & 0x40) == 0)) {
          pExpr->iColumn = -1;
          pExpr->affinity = 'D';
          goto LAB_0019afc4;
        }
        iVar13 = 1;
      }
    }
  }
  if (((pcVar29 == (char *)0x0) && ((uVar34 & 0x80) != 0)) && (local_114 == 0)) {
    pEVar6 = (pNVar16->uNC).pEList;
    if (0 < (long)pEVar6->nExpr) {
      lVar32 = 0;
      do {
        pcVar43 = pEVar6->a[lVar32].zName;
        if (pcVar43 != (char *)0x0) {
          lVar38 = 0;
          do {
            bVar3 = pcVar43[lVar38];
            if (bVar3 == zCol[lVar38]) {
              if ((ulong)bVar3 == 0) {
                pEVar22 = pEVar6->a[lVar32].pExpr;
                if (((uVar34 & 1) == 0) && ((pEVar22->flags & 0x10) != 0)) {
                  pcVar27 = "misuse of aliased aggregate %s";
LAB_0019abdd:
                  sqlite3ErrorMsg(pParse,pcVar27,pcVar43);
                  return 2;
                }
                if (((uVar34 >> 0xe & 1) == 0) && ((pEVar22->flags & 0x8000) != 0)) {
                  pcVar27 = "misuse of aliased window function %s";
                  goto LAB_0019abdd;
                }
                uVar11 = pEVar22->op;
                if (uVar11 == 0xa8) {
                  uVar11 = pEVar22->op2;
                }
                if (uVar11 == 0x83) {
                  pSVar25 = (pEVar22->x).pSelect;
LAB_0019ab77:
                  if (((anon_union_8_2_a01b6dbf_for_x *)&pSVar25->pEList)->pList->nExpr != 1) {
                    sqlite3ErrorMsg(pParse,"row value misused");
                    return 2;
                  }
                }
                else if (uVar11 == 0xa9) {
                  pSVar25 = (Select *)&pEVar22->x;
                  goto LAB_0019ab77;
                }
                resolveAlias(pParse,pEVar6,(int)lVar32,pExpr,"",local_a4);
                if (pParse->eParseMode < 2) goto LAB_0019b056;
                pRVar18 = pParse->pRename;
                goto LAB_0019abab;
              }
            }
            else if (""[bVar3] != ""[(byte)zCol[lVar38]]) break;
            lVar38 = lVar38 + 1;
          } while( true );
        }
        lVar32 = lVar32 + 1;
      } while (lVar32 != pEVar6->nExpr);
    }
  }
  else if (local_114 != 0) {
    if (local_114 != 1) {
      pcVar43 = "ambiguous column name";
      goto LAB_0019ac88;
    }
LAB_0019afc4:
    bVar47 = true;
    goto LAB_0019afd0;
  }
  pNVar16 = pNVar16->pNext;
  local_a4 = local_a4 + 1;
  if (pNVar16 == (NameContext *)0x0) goto LAB_0019ac7a;
  goto LAB_0019a3f5;
LAB_0019a861:
  pTVar33 = ((pNVar16->uNC).pUpsert)->pUpsertSrc->a[0].pTab;
  *local_b0 = 2;
  local_d4 = 2;
  goto LAB_0019a87c;
LAB_0019a8c2:
  uVar40 = uVar40 + 1;
  pCVar17 = pCVar17 + 1;
  uVar41 = uVar34;
  if (uVar40 == uVar34) goto LAB_0019a8f5;
  goto LAB_0019a899;
LAB_0019abab:
  if (pRVar18 == (RenameToken *)0x0) goto LAB_0019b056;
  if ((Expr *)pRVar18->p == pExpr) {
    pRVar18->p = (void *)0x0;
    goto LAB_0019b056;
  }
  pRVar18 = pRVar18->pNext;
  goto LAB_0019abab;
switchD_00199d68_caseD_31:
  if ((pExpr->flags & 0x800) != 0) {
    iVar13 = pNVar5->nRef;
    uVar34 = pNVar5->ncFlags;
    if ((uVar34 & 0x26) != 0) {
      pcVar27 = "CHECK constraints";
      if ((uVar34 & 4) == 0) {
        pcVar27 = "partial index WHERE clauses";
      }
      pcVar29 = "index expressions";
      if ((uVar34 & 0x20) == 0) {
        pcVar29 = pcVar27;
      }
      sqlite3ErrorMsg(pParse,"%s prohibited in %s","subqueries",pcVar29);
    }
    sqlite3WalkSelect(pWalker,(pExpr->x).pSelect);
    if (iVar13 != pNVar5->nRef) {
      *(byte *)&pExpr->flags = (byte)pExpr->flags | 0x20;
      *(byte *)&pNVar5->ncFlags = (byte)pNVar5->ncFlags | 0x40;
    }
  }
  goto switchD_00199d68_caseD_2e;
LAB_0019ac7a:
  pcVar43 = "no such column";
  if (pcVar29 == (char *)0x0) {
    if ((pExpr->flags & 0x40) != 0) {
      if ((local_a0->init).busy != '\0') {
LAB_0019b171:
        sqlite3_log(0x1c,"double-quoted string literal: \"%w\"",zCol);
        pExpr->op = 'n';
        (pExpr->y).pTab = (Table *)0x0;
        return 1;
      }
      iVar13 = 0x1e;
      uVar34 = (uint)local_a0->flags;
      if ((((pNVar5->ncFlags & 0x10000) != 0) &&
          (iVar13 = 0x1d, (uVar34 & 0x50000001) == 0x40000001)) || ((uVar34 >> iVar13 & 1) != 0))
      goto LAB_0019b171;
    }
    iVar13 = sqlite3ExprIdToTrueFalse(pExpr);
    if (iVar13 != 0) {
      return 1;
    }
    pNVar16 = (NameContext *)0x0;
  }
  else {
    pNVar16 = (NameContext *)0x0;
  }
LAB_0019ac88:
  if (pcVar27 == (char *)0x0) {
    if (pcVar29 == (char *)0x0) {
      sqlite3ErrorMsg(pParse,"%s: %s",pcVar43,zCol);
    }
    else {
      sqlite3ErrorMsg(pParse,"%s: %s.%s",pcVar43,pcVar29,zCol);
    }
  }
  else {
    sqlite3ErrorMsg(pParse,"%s: %s.%s.%s",pcVar43,pcVar27,pcVar29,zCol);
  }
  pParse->checkSchema = '\x01';
  pNVar5->nErr = pNVar5->nErr + 1;
  bVar47 = false;
LAB_0019afd0:
  uVar4 = pExpr->iColumn;
  if ((-1 < (short)uVar4) && (local_c8 != (SrcList_item *)0x0)) {
    uVar20 = 0x3f;
    if (uVar4 < 0x3f) {
      uVar20 = uVar4;
    }
    local_c8->colUsed = local_c8->colUsed | 1L << ((byte)uVar20 & 0x3f);
  }
  if (pExpr->pLeft != (Expr *)0x0) {
    sqlite3ExprDeleteNN(local_a0,pExpr->pLeft);
  }
  pExpr->pLeft = (Expr *)0x0;
  if (pExpr->pRight != (Expr *)0x0) {
    sqlite3ExprDeleteNN(local_a0,pExpr->pRight);
  }
  pExpr->pRight = (Expr *)0x0;
  pExpr->op = local_115;
  pbVar1 = (byte *)((long)&pExpr->flags + 2);
  *pbVar1 = *pbVar1 | 0x80;
  if (!bVar47) {
    return 2;
  }
LAB_0019b056:
  if ((((pExpr->flags & 0x400000) == 0) && (local_b8 != (Schema *)0x0)) &&
     (pParse->db->xAuth != (sqlite3_xauth)0x0)) {
    iVar13 = -1;
    ppSVar31 = &pParse->db->aDb->pSchema;
    do {
      iVar13 = iVar13 + 1;
      pSVar10 = *ppSVar31;
      ppSVar31 = ppSVar31 + 4;
    } while (pSVar10 != local_b8);
    if (pExpr->op == 'M') {
LAB_0019b0ae:
      pTVar33 = *ppTVar37;
      if (pTVar33 != (Table *)0x0) {
        lVar32 = (long)pExpr->iColumn;
        if ((pExpr->iColumn < 0) && (lVar32 = (long)pTVar33->iPKey, lVar32 < 0)) {
          pcVar27 = "ROWID";
        }
        else {
          pcVar27 = pTVar33->aCol[lVar32].zName;
        }
        iVar13 = sqlite3AuthReadCol(pParse,pTVar33->zName,pcVar27,iVar13);
        if (iVar13 == 2) {
          pExpr->op = 'r';
        }
      }
    }
    else {
      lVar32 = (long)pNVar16->pSrcList->nSrc;
      if (0 < lVar32) {
        ppTVar37 = &pNVar16->pSrcList->a[0].pTab;
        do {
          if (*local_b0 == *(int *)(ppTVar37 + 4)) goto LAB_0019b0ae;
          ppTVar37 = ppTVar37 + 0xe;
          lVar32 = lVar32 + -1;
        } while (lVar32 != 0);
      }
    }
  }
  pNVar5->nRef = pNVar5->nRef + 1;
  while (pNVar16 != pNVar5) {
    pNVar5 = pNVar5->pNext;
    pNVar5->nRef = pNVar5->nRef + 1;
  }
  return 1;
switchD_00199d68_caseD_2d:
  pEVar22 = pExpr->pRight;
  while (pEVar22 != (Expr *)0x0) {
    if ((pEVar22->flags & 0x41000) == 0) goto LAB_00199f45;
    if ((pEVar22->flags >> 0x12 & 1) == 0) {
      pEVar42 = (ExprList_item *)&pEVar22->pLeft;
    }
    else {
      pEVar42 = ((pEVar22->x).pList)->a;
    }
    pEVar22 = pEVar42->pExpr;
  }
  pEVar22 = (Expr *)0x0;
LAB_00199f45:
  if (pEVar22->op == ';') {
    iVar13 = resolveExprStep(pWalker,pEVar22);
    if (iVar13 == 2) {
      return 2;
    }
    if (pEVar22->op == 0x9f) {
      pExpr->op2 = pExpr->op;
      pExpr->op = 0xa7;
      return 0;
    }
  }
switchD_00199d68_caseD_30:
  if (pParse->db->mallocFailed != '\0') goto switchD_00199d68_caseD_2e;
  pEVar22 = pExpr->pLeft;
  uVar11 = pEVar22->op;
  if (uVar11 == 0xa8) {
    uVar11 = pEVar22->op2;
  }
  if (uVar11 == 0x83) {
    pSVar25 = (pEVar22->x).pSelect;
LAB_0019a010:
    iVar13 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar25->pEList)->pList->nExpr;
  }
  else {
    iVar13 = 1;
    if (uVar11 == 0xa9) {
      pSVar25 = (Select *)&pEVar22->x;
      goto LAB_0019a010;
    }
  }
  if (pExpr->op == '0') {
    pEVar22 = ((pExpr->x).pList)->a[0].pExpr;
    uVar11 = pEVar22->op;
    if (uVar11 == 0xa8) {
      uVar11 = pEVar22->op2;
    }
    if (uVar11 == 0x83) {
      pSVar25 = (pEVar22->x).pSelect;
LAB_0019a0d5:
      iVar36 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar25->pEList)->pList->nExpr;
    }
    else {
      iVar36 = 1;
      if (uVar11 == 0xa9) {
        pSVar25 = (Select *)&pEVar22->x;
        goto LAB_0019a0d5;
      }
    }
    if (iVar36 == iVar13) {
      pEVar22 = *(Expr **)((pExpr->x).pList + 1);
      goto LAB_0019a0e2;
    }
  }
  else {
    pEVar22 = pExpr->pRight;
LAB_0019a0e2:
    uVar11 = pEVar22->op;
    if (uVar11 == 0xa8) {
      uVar11 = pEVar22->op2;
    }
    if (uVar11 == 0x83) {
      pSVar25 = (pEVar22->x).pSelect;
    }
    else {
      iVar36 = 1;
      if (uVar11 != 0xa9) goto LAB_0019a110;
      pSVar25 = (Select *)&pEVar22->x;
    }
    iVar36 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar25->pEList)->pList->nExpr;
  }
LAB_0019a110:
  if (iVar13 != iVar36) {
    sqlite3ErrorMsg(pParse,"row value misused");
  }
switchD_00199d68_caseD_2e:
  iVar13 = 2;
  if (pParse->nErr == 0) {
    iVar13 = (uint)(pParse->db->mallocFailed != '\0') * 2;
  }
  return iVar13;
}

Assistant:

static int resolveExprStep(Walker *pWalker, Expr *pExpr){
  NameContext *pNC;
  Parse *pParse;

  pNC = pWalker->u.pNC;
  assert( pNC!=0 );
  pParse = pNC->pParse;
  assert( pParse==pWalker->pParse );

#ifndef NDEBUG
  if( pNC->pSrcList && pNC->pSrcList->nAlloc>0 ){
    SrcList *pSrcList = pNC->pSrcList;
    int i;
    for(i=0; i<pNC->pSrcList->nSrc; i++){
      assert( pSrcList->a[i].iCursor>=0 && pSrcList->a[i].iCursor<pParse->nTab);
    }
  }
#endif
  switch( pExpr->op ){

#if defined(SQLITE_ENABLE_UPDATE_DELETE_LIMIT) && !defined(SQLITE_OMIT_SUBQUERY)
    /* The special operator TK_ROW means use the rowid for the first
    ** column in the FROM clause.  This is used by the LIMIT and ORDER BY
    ** clause processing on UPDATE and DELETE statements.
    */
    case TK_ROW: {
      SrcList *pSrcList = pNC->pSrcList;
      struct SrcList_item *pItem;
      assert( pSrcList && pSrcList->nSrc==1 );
      pItem = pSrcList->a;
      assert( HasRowid(pItem->pTab) && pItem->pTab->pSelect==0 );
      pExpr->op = TK_COLUMN;
      pExpr->y.pTab = pItem->pTab;
      pExpr->iTable = pItem->iCursor;
      pExpr->iColumn = -1;
      pExpr->affinity = SQLITE_AFF_INTEGER;
      break;
    }
#endif /* defined(SQLITE_ENABLE_UPDATE_DELETE_LIMIT)
          && !defined(SQLITE_OMIT_SUBQUERY) */

    /* A column name:                    ID
    ** Or table name and column name:    ID.ID
    ** Or a database, table and column:  ID.ID.ID
    **
    ** The TK_ID and TK_OUT cases are combined so that there will only
    ** be one call to lookupName().  Then the compiler will in-line 
    ** lookupName() for a size reduction and performance increase.
    */
    case TK_ID:
    case TK_DOT: {
      const char *zColumn;
      const char *zTable;
      const char *zDb;
      Expr *pRight;

      if( pExpr->op==TK_ID ){
        zDb = 0;
        zTable = 0;
        zColumn = pExpr->u.zToken;
      }else{
        Expr *pLeft = pExpr->pLeft;
        notValid(pParse, pNC, "the \".\" operator", NC_IdxExpr);
        pRight = pExpr->pRight;
        if( pRight->op==TK_ID ){
          zDb = 0;
        }else{
          assert( pRight->op==TK_DOT );
          zDb = pLeft->u.zToken;
          pLeft = pRight->pLeft;
          pRight = pRight->pRight;
        }
        zTable = pLeft->u.zToken;
        zColumn = pRight->u.zToken;
        if( IN_RENAME_OBJECT ){
          sqlite3RenameTokenRemap(pParse, (void*)pExpr, (void*)pRight);
          sqlite3RenameTokenRemap(pParse, (void*)&pExpr->y.pTab, (void*)pLeft);
        }
      }
      return lookupName(pParse, zDb, zTable, zColumn, pNC, pExpr);
    }

    /* Resolve function names
    */
    case TK_FUNCTION: {
      ExprList *pList = pExpr->x.pList;    /* The argument list */
      int n = pList ? pList->nExpr : 0;    /* Number of arguments */
      int no_such_func = 0;       /* True if no such function exists */
      int wrong_num_args = 0;     /* True if wrong number of arguments */
      int is_agg = 0;             /* True if is an aggregate function */
      int nId;                    /* Number of characters in function name */
      const char *zId;            /* The function name. */
      FuncDef *pDef;              /* Information about the function */
      u8 enc = ENC(pParse->db);   /* The database encoding */
      int savedAllowFlags = (pNC->ncFlags & (NC_AllowAgg | NC_AllowWin));

      assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
      zId = pExpr->u.zToken;
      nId = sqlite3Strlen30(zId);
      pDef = sqlite3FindFunction(pParse->db, zId, n, enc, 0);
      if( pDef==0 ){
        pDef = sqlite3FindFunction(pParse->db, zId, -2, enc, 0);
        if( pDef==0 ){
          no_such_func = 1;
        }else{
          wrong_num_args = 1;
        }
      }else{
        is_agg = pDef->xFinalize!=0;
        if( pDef->funcFlags & SQLITE_FUNC_UNLIKELY ){
          ExprSetProperty(pExpr, EP_Unlikely);
          if( n==2 ){
            pExpr->iTable = exprProbability(pList->a[1].pExpr);
            if( pExpr->iTable<0 ){
              sqlite3ErrorMsg(pParse,
                "second argument to likelihood() must be a "
                "constant between 0.0 and 1.0");
              pNC->nErr++;
            }
          }else{
            /* EVIDENCE-OF: R-61304-29449 The unlikely(X) function is
            ** equivalent to likelihood(X, 0.0625).
            ** EVIDENCE-OF: R-01283-11636 The unlikely(X) function is
            ** short-hand for likelihood(X,0.0625).
            ** EVIDENCE-OF: R-36850-34127 The likely(X) function is short-hand
            ** for likelihood(X,0.9375).
            ** EVIDENCE-OF: R-53436-40973 The likely(X) function is equivalent
            ** to likelihood(X,0.9375). */
            /* TUNING: unlikely() probability is 0.0625.  likely() is 0.9375 */
            pExpr->iTable = pDef->zName[0]=='u' ? 8388608 : 125829120;
          }             
        }
#ifndef SQLITE_OMIT_AUTHORIZATION
        {
          int auth = sqlite3AuthCheck(pParse, SQLITE_FUNCTION, 0,pDef->zName,0);
          if( auth!=SQLITE_OK ){
            if( auth==SQLITE_DENY ){
              sqlite3ErrorMsg(pParse, "not authorized to use function: %s",
                                      pDef->zName);
              pNC->nErr++;
            }
            pExpr->op = TK_NULL;
            return WRC_Prune;
          }
        }
#endif
        if( pDef->funcFlags & (SQLITE_FUNC_CONSTANT|SQLITE_FUNC_SLOCHNG) ){
          /* For the purposes of the EP_ConstFunc flag, date and time
          ** functions and other functions that change slowly are considered
          ** constant because they are constant for the duration of one query */
          ExprSetProperty(pExpr,EP_ConstFunc);
        }
        if( (pDef->funcFlags & SQLITE_FUNC_CONSTANT)==0 ){
          /* Date/time functions that use 'now', and other functions like
          ** sqlite_version() that might change over time cannot be used
          ** in an index. */
          notValid(pParse, pNC, "non-deterministic functions",
                   NC_IdxExpr|NC_PartIdx);
        }
        if( (pDef->funcFlags & SQLITE_FUNC_INTERNAL)!=0
         && pParse->nested==0
         && sqlite3Config.bInternalFunctions==0
        ){
          /* Internal-use-only functions are disallowed unless the
          ** SQL is being compiled using sqlite3NestedParse() */
          no_such_func = 1;
          pDef = 0;
        }
      }

      if( 0==IN_RENAME_OBJECT ){
#ifndef SQLITE_OMIT_WINDOWFUNC
        assert( is_agg==0 || (pDef->funcFlags & SQLITE_FUNC_MINMAX)
          || (pDef->xValue==0 && pDef->xInverse==0)
          || (pDef->xValue && pDef->xInverse && pDef->xSFunc && pDef->xFinalize)
        );
        if( pDef && pDef->xValue==0 && ExprHasProperty(pExpr, EP_WinFunc) ){
          sqlite3ErrorMsg(pParse, 
              "%.*s() may not be used as a window function", nId, zId
          );
          pNC->nErr++;
        }else if( 
              (is_agg && (pNC->ncFlags & NC_AllowAgg)==0)
           || (is_agg && (pDef->funcFlags&SQLITE_FUNC_WINDOW) && !pExpr->y.pWin)
           || (is_agg && pExpr->y.pWin && (pNC->ncFlags & NC_AllowWin)==0)
        ){
          const char *zType;
          if( (pDef->funcFlags & SQLITE_FUNC_WINDOW) || pExpr->y.pWin ){
            zType = "window";
          }else{
            zType = "aggregate";
          }
          sqlite3ErrorMsg(pParse, "misuse of %s function %.*s()",zType,nId,zId);
          pNC->nErr++;
          is_agg = 0;
        }
#else
        if( (is_agg && (pNC->ncFlags & NC_AllowAgg)==0) ){
          sqlite3ErrorMsg(pParse,"misuse of aggregate function %.*s()",nId,zId);
          pNC->nErr++;
          is_agg = 0;
        }
#endif
        else if( no_such_func && pParse->db->init.busy==0
#ifdef SQLITE_ENABLE_UNKNOWN_SQL_FUNCTION
                  && pParse->explain==0
#endif
        ){
          sqlite3ErrorMsg(pParse, "no such function: %.*s", nId, zId);
          pNC->nErr++;
        }else if( wrong_num_args ){
          sqlite3ErrorMsg(pParse,"wrong number of arguments to function %.*s()",
               nId, zId);
          pNC->nErr++;
        }
        if( is_agg ){
          /* Window functions may not be arguments of aggregate functions.
          ** Or arguments of other window functions. But aggregate functions
          ** may be arguments for window functions.  */
#ifndef SQLITE_OMIT_WINDOWFUNC
          pNC->ncFlags &= ~(NC_AllowWin | (!pExpr->y.pWin ? NC_AllowAgg : 0));
#else
          pNC->ncFlags &= ~NC_AllowAgg;
#endif
        }
      }
      sqlite3WalkExprList(pWalker, pList);
      if( is_agg ){
#ifndef SQLITE_OMIT_WINDOWFUNC
        if( pExpr->y.pWin ){
          Select *pSel = pNC->pWinSelect;
          if( IN_RENAME_OBJECT==0 ){
            sqlite3WindowUpdate(pParse, pSel->pWinDefn, pExpr->y.pWin, pDef);
          }
          sqlite3WalkExprList(pWalker, pExpr->y.pWin->pPartition);
          sqlite3WalkExprList(pWalker, pExpr->y.pWin->pOrderBy);
          sqlite3WalkExpr(pWalker, pExpr->y.pWin->pFilter);
          if( 0==pSel->pWin 
           || 0==sqlite3WindowCompare(pParse, pSel->pWin, pExpr->y.pWin) 
          ){
            pExpr->y.pWin->pNextWin = pSel->pWin;
            pSel->pWin = pExpr->y.pWin;
          }
          pNC->ncFlags |= NC_HasWin;
        }else
#endif /* SQLITE_OMIT_WINDOWFUNC */
        {
          NameContext *pNC2 = pNC;
          pExpr->op = TK_AGG_FUNCTION;
          pExpr->op2 = 0;
          while( pNC2 && !sqlite3FunctionUsesThisSrc(pExpr, pNC2->pSrcList) ){
            pExpr->op2++;
            pNC2 = pNC2->pNext;
          }
          assert( pDef!=0 );
          if( pNC2 ){
            assert( SQLITE_FUNC_MINMAX==NC_MinMaxAgg );
            testcase( (pDef->funcFlags & SQLITE_FUNC_MINMAX)!=0 );
            pNC2->ncFlags |= NC_HasAgg | (pDef->funcFlags & SQLITE_FUNC_MINMAX);

          }
        }
        pNC->ncFlags |= savedAllowFlags;
      }
      /* FIX ME:  Compute pExpr->affinity based on the expected return
      ** type of the function 
      */
      return WRC_Prune;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_SELECT:
    case TK_EXISTS:  testcase( pExpr->op==TK_EXISTS );
#endif
    case TK_IN: {
      testcase( pExpr->op==TK_IN );
      if( ExprHasProperty(pExpr, EP_xIsSelect) ){
        int nRef = pNC->nRef;
        notValid(pParse, pNC, "subqueries", NC_IsCheck|NC_PartIdx|NC_IdxExpr);
        sqlite3WalkSelect(pWalker, pExpr->x.pSelect);
        assert( pNC->nRef>=nRef );
        if( nRef!=pNC->nRef ){
          ExprSetProperty(pExpr, EP_VarSelect);
          pNC->ncFlags |= NC_VarSelect;
        }
      }
      break;
    }
    case TK_VARIABLE: {
      notValid(pParse, pNC, "parameters", NC_IsCheck|NC_PartIdx|NC_IdxExpr);
      break;
    }
    case TK_IS:
    case TK_ISNOT: {
      Expr *pRight = sqlite3ExprSkipCollate(pExpr->pRight);
      assert( !ExprHasProperty(pExpr, EP_Reduced) );
      /* Handle special cases of "x IS TRUE", "x IS FALSE", "x IS NOT TRUE",
      ** and "x IS NOT FALSE". */
      if( pRight->op==TK_ID ){
        int rc = resolveExprStep(pWalker, pRight);
        if( rc==WRC_Abort ) return WRC_Abort;
        if( pRight->op==TK_TRUEFALSE ){
          pExpr->op2 = pExpr->op;
          pExpr->op = TK_TRUTH;
          return WRC_Continue;
        }
      }
      /* Fall thru */
    }
    case TK_BETWEEN:
    case TK_EQ:
    case TK_NE:
    case TK_LT:
    case TK_LE:
    case TK_GT:
    case TK_GE: {
      int nLeft, nRight;
      if( pParse->db->mallocFailed ) break;
      assert( pExpr->pLeft!=0 );
      nLeft = sqlite3ExprVectorSize(pExpr->pLeft);
      if( pExpr->op==TK_BETWEEN ){
        nRight = sqlite3ExprVectorSize(pExpr->x.pList->a[0].pExpr);
        if( nRight==nLeft ){
          nRight = sqlite3ExprVectorSize(pExpr->x.pList->a[1].pExpr);
        }
      }else{
        assert( pExpr->pRight!=0 );
        nRight = sqlite3ExprVectorSize(pExpr->pRight);
      }
      if( nLeft!=nRight ){
        testcase( pExpr->op==TK_EQ );
        testcase( pExpr->op==TK_NE );
        testcase( pExpr->op==TK_LT );
        testcase( pExpr->op==TK_LE );
        testcase( pExpr->op==TK_GT );
        testcase( pExpr->op==TK_GE );
        testcase( pExpr->op==TK_IS );
        testcase( pExpr->op==TK_ISNOT );
        testcase( pExpr->op==TK_BETWEEN );
        sqlite3ErrorMsg(pParse, "row value misused");
      }
      break; 
    }
  }
  return (pParse->nErr || pParse->db->mallocFailed) ? WRC_Abort : WRC_Continue;
}